

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::GetDatePartFunction<duckdb::DatePart::DayOfWeekOperator>(void)

{
  ScalarFunctionSet *in_RDI;
  scalar_function_t local_48;
  code *local_28;
  undefined8 uStack_20;
  code *local_18;
  code *pcStack_10;
  
  uStack_20 = 0;
  local_28 = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::DayOfWeekOperator>;
  pcStack_10 = ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::DayOfWeekOperator>;
  local_48._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(duckdb *)&local_28,&local_48,(scalar_function_t *)&stack0xffffffffffffff98,
             (scalar_function_t *)DatePart::DayOfWeekOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::DayOfWeekOperator::PropagateStatistics<duckdb::timestamp_t>,
             ScalarFunction::
             UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::DayOfWeekOperator>);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff98,(_Any_data *)&stack0xffffffffffffff98,
               __destroy_functor);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return in_RDI;
}

Assistant:

static ScalarFunctionSet GetDatePartFunction() {
	return GetGenericDatePartFunction(
	    DatePart::UnaryFunction<date_t, int64_t, OP>, DatePart::UnaryFunction<timestamp_t, int64_t, OP>,
	    ScalarFunction::UnaryFunction<interval_t, int64_t, OP>, OP::template PropagateStatistics<date_t>,
	    OP::template PropagateStatistics<timestamp_t>);
}